

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O1

void __thiscall
CommandDrawNumber::Tick
          (CommandDrawNumber *this,SBarInfoMainBlock *block,DSBarInfo *statusBar,bool hudChanged)

{
  FString *this_00;
  int iVar1;
  int iVar2;
  player_t *ppVar3;
  APlayerPawn *pAVar4;
  SBarInfo *pSVar5;
  char *pcVar6;
  PClass *pPVar7;
  char cVar8;
  uint uVar9;
  int iVar10;
  AInventory *pAVar11;
  FBaseCVar *pFVar12;
  AAmmo *pAVar13;
  Node *pNVar14;
  undefined4 extraout_var;
  int iVar15;
  PClass *pPVar16;
  AInventory *pAVar17;
  long lVar18;
  BYTE *pBVar19;
  int iVar20;
  char cVar21;
  bool bVar22;
  bool bVar23;
  double dVar24;
  
  if ((this->super_CommandDrawString).field_0x5f == '\x01') {
    (this->super_CommandDrawString).cache = -1;
    CommandDrawString::Tick(&this->super_CommandDrawString,block,statusBar,hudChanged);
  }
  iVar20 = (this->super_CommandDrawString).valueArgument;
  if (INTCVAR < this->value) goto LAB_004c71b0;
  switch(this->value) {
  case HEALTH:
    iVar10 = (((statusBar->super_DBaseStatusBar).CPlayer)->mo->super_AActor).health;
    pSVar5 = (this->super_CommandDrawString).super_SBarInfoCommand.script;
    iVar20 = 0;
    if (0 < iVar10) {
      iVar20 = iVar10;
    }
    if (pSVar5->lowerHealthCap == false) {
      iVar20 = iVar10;
    }
    if (pSVar5->interpolateHealth == true) {
      iVar10 = pSVar5->interpolationSpeed;
LAB_004c71a0:
      this->interpolationSpeed = iVar10;
    }
    break;
  case ARMOR:
    if (statusBar->armor == (ABasicArmor *)0x0) {
      iVar20 = 0;
    }
    else {
      iVar20 = (statusBar->armor->super_AArmor).super_AInventory.Amount;
    }
    pSVar5 = (this->super_CommandDrawString).super_SBarInfoCommand.script;
    if (pSVar5->interpolateArmor == true) {
      iVar10 = pSVar5->armorInterpolationSpeed;
      goto LAB_004c71a0;
    }
    break;
  case AMMO1:
    if (statusBar->ammo1 == (AAmmo *)0x0) goto LAB_004c71e5;
    iVar20 = statusBar->ammocount1;
    break;
  case AMMO2:
    if (statusBar->ammo2 == (AAmmo *)0x0) goto LAB_004c71e5;
    iVar20 = statusBar->ammocount2;
    break;
  default:
    pAVar11 = AActor::FindInventory
                        (&((statusBar->super_DBaseStatusBar).CPlayer)->mo->super_AActor,
                         this->inventoryItem,false);
    iVar20 = 0;
    if (pAVar11 != (AInventory *)0x0) {
LAB_004c6d12:
      iVar20 = pAVar11->Amount;
    }
    break;
  case AMMO1CAPACITY:
    pAVar13 = statusBar->ammo1;
    goto LAB_004c6ef1;
  case AMMO2CAPACITY:
    pAVar13 = statusBar->ammo2;
LAB_004c6ef1:
    if (pAVar13 == (AAmmo *)0x0) goto LAB_004c71e5;
LAB_004c6f36:
    iVar20 = (pAVar13->super_AInventory).MaxAmount;
    break;
  case AMMOCAPACITY:
    pAVar13 = (AAmmo *)AActor::FindInventory
                                 (&((statusBar->super_DBaseStatusBar).CPlayer)->mo->super_AActor,
                                  this->inventoryItem,false);
    if (pAVar13 == (AAmmo *)0x0) {
      pAVar13 = (AAmmo *)(this->inventoryItem->super_PClass).Defaults;
    }
    goto LAB_004c6f36;
  case FRAGS:
    iVar20 = ((statusBar->super_DBaseStatusBar).CPlayer)->fragcount;
    break;
  case KILLS:
    iVar20 = level.killed_monsters;
    break;
  case MONSTERS:
    iVar20 = level.total_monsters;
    break;
  case ITEMS:
    iVar20 = level.found_items;
    break;
  case TOTALITEMS:
    iVar20 = level.total_items;
    break;
  case SECRETS:
    iVar20 = level.found_secrets;
    break;
  case TOTALSECRETS:
    iVar20 = level.total_secrets;
    break;
  case ARMORCLASS:
  case SAVEPERCENT:
    pAVar11 = AActor::FindInventory
                        (&((statusBar->super_DBaseStatusBar).CPlayer)->mo->super_AActor,
                         (PClassActor *)AHexenArmor::RegistrationInfo.MyClass,false);
    if (pAVar11 == (AInventory *)0x0) {
      dVar24 = 0.0;
    }
    else {
      dVar24 = (double)pAVar11[1].super_AActor.super_DThinker.super_DObject._vptr_DObject +
               (double)pAVar11[1].super_AActor.super_DThinker.super_DObject.Class +
               (double)pAVar11[1].super_AActor.super_DThinker.super_DObject.ObjNext +
               (double)pAVar11[1].super_AActor.super_DThinker.super_DObject.GCNext +
               *(double *)&pAVar11[1].super_AActor.super_DThinker.super_DObject.ObjectFlags;
    }
    if (statusBar->armor != (ABasicArmor *)0x0) {
      dVar24 = dVar24 + statusBar->armor->SavePercent * 100.0;
    }
    if (this->value == ARMORCLASS) {
      dVar24 = dVar24 / 5.0;
    }
    iVar20 = (int)dVar24;
    break;
  case GLOBALVAR:
    iVar20 = ACS_GlobalVars[iVar20];
    break;
  case GLOBALARRAY:
    pNVar14 = TMap<int,_int,_THashTraits<int>,_InitIntToZero>::GetNode
                        (ACS_GlobalArrays + iVar20,consoleplayer);
    iVar20 = (pNVar14->Pair).Value;
    break;
  case POWERUPTIME:
    pAVar11 = AActor::FindInventory
                        (&((statusBar->super_DBaseStatusBar).CPlayer)->mo->super_AActor,
                         *(PClassActor **)((this->inventoryItem->super_PClass).Defaults + 0x500),
                         false);
    if (pAVar11 != (AInventory *)0x0) {
      iVar20 = *(int *)&pAVar11->field_0x4fc / 0x23 + 1;
    }
    break;
  case AIRTIME:
    ppVar3 = (statusBar->super_DBaseStatusBar).CPlayer;
    if ((ppVar3->mo->super_AActor).waterlevel < 3) {
      iVar20 = level.airsupply / 0x23;
    }
    else {
      iVar20 = ppVar3->air_finished - level.time;
      iVar20 = iVar20 + (int)((ulong)((long)(iVar20 + 0x22) * -0x15f15f15) >> 0x20) + 0x22;
      iVar10 = (iVar20 >> 5) - (iVar20 >> 0x1f);
      iVar20 = 0;
      if (0 < iVar10) {
        iVar20 = iVar10;
      }
    }
    break;
  case SELECTEDINVENTORY:
    pAVar4 = ((statusBar->super_DBaseStatusBar).CPlayer)->mo;
    pAVar11 = (pAVar4->InvSel).field_0.p;
    if (pAVar11 != (AInventory *)0x0) {
      if (((pAVar11->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) == 0) {
        pAVar11 = (((statusBar->super_DBaseStatusBar).CPlayer)->mo->InvSel).field_0.p;
        goto LAB_004c6d12;
      }
      (pAVar4->InvSel).field_0.p = (AInventory *)0x0;
    }
    break;
  case SCORE:
    iVar20 = (((statusBar->super_DBaseStatusBar).CPlayer)->mo->super_AActor).Score;
    break;
  case ACCURACY:
    iVar20 = (((statusBar->super_DBaseStatusBar).CPlayer)->mo->super_AActor).accuracy;
    break;
  case STAMINA:
    iVar20 = (((statusBar->super_DBaseStatusBar).CPlayer)->mo->super_AActor).stamina;
    break;
  case KEYS:
    pAVar4 = ((statusBar->super_DBaseStatusBar).CPlayer)->mo;
    pAVar11 = (pAVar4->super_AActor).Inventory.field_0.p;
    if ((pAVar11 != (AInventory *)0x0) &&
       (((pAVar11->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) != 0)) {
      (pAVar4->super_AActor).Inventory.field_0.p = (AInventory *)0x0;
      pAVar11 = (AInventory *)0x0;
    }
    if (pAVar11 == (AInventory *)0x0) {
LAB_004c7109:
      iVar20 = 0;
    }
    else {
      iVar20 = 0;
      do {
        pPVar7 = AKey::RegistrationInfo.MyClass;
        if ((pAVar11->super_AActor).super_DThinker.super_DObject.Class == (PClass *)0x0) {
          iVar10 = (**(pAVar11->super_AActor).super_DThinker.super_DObject._vptr_DObject)(pAVar11);
          (pAVar11->super_AActor).super_DThinker.super_DObject.Class =
               (PClass *)CONCAT44(extraout_var,iVar10);
        }
        pPVar16 = (pAVar11->super_AActor).super_DThinker.super_DObject.Class;
        bVar22 = pPVar16 != (PClass *)0x0;
        if (pPVar16 != pPVar7 && bVar22) {
          do {
            pPVar16 = pPVar16->ParentClass;
            bVar22 = pPVar16 != (PClass *)0x0;
            if (pPVar16 == pPVar7) break;
          } while (pPVar16 != (PClass *)0x0);
        }
        pAVar17 = (pAVar11->super_AActor).Inventory.field_0.p;
        if ((pAVar17 != (AInventory *)0x0) &&
           (((pAVar17->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) != 0)) {
          (pAVar11->super_AActor).Inventory.field_0.p = (AInventory *)0x0;
          pAVar17 = (AInventory *)0x0;
        }
        iVar20 = iVar20 + (uint)bVar22;
        pAVar11 = pAVar17;
      } while (pAVar17 != (AInventory *)0x0);
    }
    break;
  case INTCVAR:
    pFVar12 = GetCVar(&((statusBar->super_DBaseStatusBar).CPlayer)->mo->super_AActor,
                      (this->cvarName).Chars);
    if ((pFVar12 == (FBaseCVar *)0x0) ||
       (uVar9 = (*pFVar12->_vptr_FBaseCVar[2])(pFVar12), 1 < uVar9)) goto LAB_004c7109;
    iVar20 = (*pFVar12->_vptr_FBaseCVar[4])(pFVar12,1);
  }
LAB_004c71b0:
  iVar10 = this->interpolationSpeed;
  if ((iVar10 == 0) || ((hudChanged && (level.time != 1)))) {
    this->drawValue = iVar20;
  }
  else {
    iVar1 = this->drawValue;
    if (iVar20 < iVar1) {
      iVar20 = iVar1 - iVar20 >> 2;
      if (iVar20 < iVar10) {
        iVar10 = iVar20;
      }
      iVar15 = 1;
      if (1 < iVar20) {
        iVar15 = iVar10;
      }
      this->drawValue = iVar1 - iVar15;
    }
    else if (iVar20 - iVar1 != 0 && iVar1 <= iVar20) {
      iVar20 = iVar20 - iVar1 >> 2;
      if (iVar20 < iVar10) {
        iVar10 = iVar20;
      }
      iVar15 = 1;
      if (1 < iVar20) {
        iVar15 = iVar10;
      }
      this->drawValue = iVar15 + iVar1;
    }
  }
  iVar20 = this->drawValue;
  if ((iVar20 == 0 & (this->super_CommandDrawString).field_0x5d) == 1) {
LAB_004c71e5:
    FString::operator=(&(this->super_CommandDrawString).str,(char *)"");
    return;
  }
  iVar10 = this->lowValue;
  (this->super_CommandDrawString).translation = this->normalTranslation;
  lVar18 = 0x70;
  if ((iVar20 <= iVar10 && iVar10 != -1) ||
     (lVar18 = 0x78, this->highValue <= iVar20 && this->highValue != -1)) {
    (this->super_CommandDrawString).translation =
         *(EColorRange *)
          ((long)&(this->super_CommandDrawString).super_SBarInfoCommand._vptr_SBarInfoCommand +
          lVar18);
  }
  cVar21 = (this->super_CommandDrawString).field_0x5c;
  iVar10 = this->length;
  if ((this->super_CommandDrawString).field_0x5e == '\0') {
    iVar20 = 0x7fffffff;
    if (iVar10 < 10) {
      dVar24 = pow(10.0,(double)iVar10);
      dVar24 = ceil(dVar24);
      iVar20 = (int)dVar24 + -1;
    }
    iVar10 = iVar20;
    if (((this->super_CommandDrawString).field_0x5c == '\x01') && (iVar1 = this->length, iVar1 != 1)
       ) {
      iVar2 = this->drawValue;
      iVar15 = -0x80000000;
      if (iVar1 < 10) {
        dVar24 = pow(10.0,(double)(iVar1 + -1));
        dVar24 = ceil(dVar24);
        iVar15 = (int)-(dVar24 + -1.0);
      }
      if (iVar2 < iVar20) {
        iVar10 = iVar2;
      }
      bVar23 = SBORROW4(iVar2,iVar15);
      iVar20 = iVar2 - iVar15;
      bVar22 = iVar2 == iVar15;
    }
    else {
      iVar1 = this->drawValue;
      iVar15 = -iVar20;
      if (iVar1 < iVar20) {
        iVar10 = iVar1;
      }
      bVar23 = SBORROW4(iVar1,iVar15);
      iVar20 = iVar1 + iVar20;
      bVar22 = iVar1 == iVar15;
    }
    if (bVar22 || bVar23 != iVar20 < 0) {
      iVar10 = iVar15;
    }
  }
  else {
    if (9 < iVar10) goto LAB_004c738f;
    dVar24 = pow(10.0,(double)(int)(iVar10 - (uint)(iVar20 < 0 && 1 < iVar10)));
    dVar24 = ceil(dVar24);
    cVar8 = '\x01';
    if (this->drawValue < (int)dVar24) {
      cVar8 = cVar21;
    }
    cVar21 = cVar8;
    iVar10 = this->drawValue % (int)dVar24;
  }
  this->drawValue = iVar10;
LAB_004c738f:
  if ((this->super_CommandDrawString).field_0x5f == '\0') {
    pBVar19 = "";
  }
  else {
    pBVar19 = (BYTE *)(this->super_CommandDrawString).str.Chars;
  }
  this_00 = &(this->super_CommandDrawString).str;
  pcVar6 = (this->prefixPadding).Chars;
  if (cVar21 == '\0') {
    FString::Format(this_00,"%s%s%d",pBVar19,pcVar6,(ulong)(uint)this->drawValue);
  }
  else {
    FString::Format(this_00,"%s%s%0*d",pBVar19,pcVar6,
                    (ulong)(uint)((this->drawValue >> 0x1f) + this->length));
  }
  CommandDrawString::RealignString(&this->super_CommandDrawString);
  return;
}

Assistant:

void	Tick(const SBarInfoMainBlock *block, const DSBarInfo *statusBar, bool hudChanged)
		{
			if(usePrefix)
			{
				cache = -1; // Disable the cache since we are using the same variables.
				CommandDrawString::Tick(block, statusBar, hudChanged);
			}

			int num = valueArgument;
			switch(value)
			{
				case HEALTH:
					num = statusBar->CPlayer->mo->health;
					if(script->lowerHealthCap && num < 0) //health shouldn't display negatives
						num = 0;
					if(script->interpolateHealth)
						interpolationSpeed = script->interpolationSpeed;
					break;
				case ARMOR:
					num = statusBar->armor != NULL ? statusBar->armor->Amount : 0;
					if(script->interpolateArmor)
						interpolationSpeed = script->armorInterpolationSpeed;
					break;
				case AMMO1:
					if(statusBar->ammo1 == NULL) //no ammo, do not draw
					{
						str = "";
						return;
					}
					num = statusBar->ammocount1;
					break;
				case AMMO2:
					if(statusBar->ammo2 == NULL) //no ammo, do not draw
					{
						str = "";
						return;
					}
					num = statusBar->ammocount2;
					break;
				case AMMO:
				{
					AInventory* item = statusBar->CPlayer->mo->FindInventory(inventoryItem);
					if(item != NULL)
						num = item->Amount;
					else
						num = 0;
					break;
				}
				case AMMO1CAPACITY:
					if(statusBar->ammo1 == NULL) //no ammo, do not draw
					{
						str = "";
						return;
					}
					else
						num = statusBar->ammo1->MaxAmount;
					break;
				case AMMO2CAPACITY:
					if(statusBar->ammo2 == NULL) //no ammo, do not draw
					{
						str = "";
						return;
					}
					else
						num = statusBar->ammo2->MaxAmount;
					break;
				case AMMOCAPACITY:
				{
					AInventory* item = statusBar->CPlayer->mo->FindInventory(inventoryItem);
					if(item != NULL)
						num = item->MaxAmount;
					else
						num = ((AInventory *)GetDefaultByType(inventoryItem))->MaxAmount;
					break;
				}
				case FRAGS:
					num = statusBar->CPlayer->fragcount;
					break;
				case KILLS:
					num = level.killed_monsters;
					break;
				case MONSTERS:
					num = level.total_monsters;
					break;
				case ITEMS:
					num = level.found_items;
					break;
				case TOTALITEMS:
					num = level.total_items;
					break;
				case SECRETS:
					num = level.found_secrets;
					break;
				case SCORE:
					num = statusBar->CPlayer->mo->Score;
					break;
				case TOTALSECRETS:
					num = level.total_secrets;
					break;
				case ARMORCLASS:
				case SAVEPERCENT:
				{
					double add = 0;
					AHexenArmor *harmor = statusBar->CPlayer->mo->FindInventory<AHexenArmor>();
					if(harmor != NULL)
					{
						add = harmor->Slots[0] + harmor->Slots[1] +
							harmor->Slots[2] + harmor->Slots[3] + harmor->Slots[4];
					}
					//Hexen counts basic armor also so we should too.
					if(statusBar->armor != NULL)
					{
						add += statusBar->armor->SavePercent * 100;
					}
					if(value == ARMORCLASS)
						add /= 5;
					num = int(add);
					break;
				}
				case GLOBALVAR:
					num = ACS_GlobalVars[valueArgument];
					break;
				case GLOBALARRAY:
					num = ACS_GlobalArrays[valueArgument][consoleplayer];
					break;
				case POWERUPTIME:
				{
					//Get the PowerupType and check to see if the player has any in inventory.
					PClassActor* powerupType = ((APowerupGiver*) GetDefaultByType(inventoryItem))->PowerupType;
					APowerup* powerup = (APowerup*) statusBar->CPlayer->mo->FindInventory(powerupType);
					if(powerup != NULL)
						num = powerup->EffectTics / TICRATE + 1;
					break;
				}
				case INVENTORY:
				{
					AInventory* item = statusBar->CPlayer->mo->FindInventory(inventoryItem);
					if(item != NULL)
						num = item->Amount;
					else
						num = 0;
					break;
				}
				case AIRTIME:
				{
					if(statusBar->CPlayer->mo->waterlevel < 3)
						num = level.airsupply/TICRATE;
					else
						num = clamp<int>((statusBar->CPlayer->air_finished - level.time + (TICRATE-1))/TICRATE, 0, INT_MAX);
					break;
				}
				case SELECTEDINVENTORY:
					if(statusBar->CPlayer->mo->InvSel != NULL)
						num = statusBar->CPlayer->mo->InvSel->Amount;
					break;
				case ACCURACY:
					num = statusBar->CPlayer->mo->accuracy;
					break;
				case STAMINA:
					num = statusBar->CPlayer->mo->stamina;
					break;
				case KEYS:
					num = 0;
					for(AInventory *item = statusBar->CPlayer->mo->Inventory;item != NULL;item = item->Inventory)
					{
						if(item->IsKindOf(RUNTIME_CLASS(AKey)))
							num++;
					}
					break;
				case INTCVAR:
				{
					FBaseCVar *CVar = GetCVar(statusBar->CPlayer->mo, cvarName);
					if (CVar != nullptr)
					{
						ECVarType cvartype = CVar->GetRealType();

						if (cvartype == CVAR_Bool || cvartype == CVAR_Int)
						{
							num = CVar->GetGenericRep(CVAR_Int).Int;
							break;
						}
					}

					// Fallback in case of bad cvar/type. Unset can remove a cvar at will.
					num = 0;
					break;
				}
				default: break;
			}
			if(interpolationSpeed != 0 && (!hudChanged || level.time == 1))
			{
				if(num < drawValue)
					drawValue -= clamp<int>((drawValue - num) >> 2, 1, interpolationSpeed);
				else if(drawValue < num)
					drawValue += clamp<int>((num - drawValue) >> 2, 1, interpolationSpeed);
			}
			else
				drawValue = num;
			if(whenNotZero && drawValue == 0)
			{
				str = "";
				return;
			}
		
			translation = normalTranslation;
			if(lowValue != -1 && drawValue <= lowValue) //low
				translation = lowTranslation;
			else if(highValue != -1 && drawValue >= highValue) //high
				translation = highTranslation;

			bool useFillZeros = fillZeros;
			if(!dontCap)
			{
				// 10^9 is a largest we can hold in a 32-bit int.  So if we go any larger we have to toss out the positions limit.
				int maxval = length <= 9 ? (int) ceil(pow(10., length))-1 : INT_MAX;
				if(!fillZeros || length == 1)
					drawValue = clamp(drawValue, -maxval, maxval);
				else //The community wanted negatives to take the last digit, but we can only do this if there is room
					drawValue = clamp(drawValue, length <= 9 ? (int) -(ceil(pow(10., length-1))-1) : INT_MIN, maxval);
			}
			else if(length <= 9)
			{
				int limit = (int) ceil(pow(10., length > 1 && drawValue < 0 ? length - 1 : length));
				if(drawValue >= limit)
					useFillZeros = true;
				drawValue = drawValue%limit;
			}

			if(useFillZeros)
				str.Format("%s%s%0*d", usePrefix ? str.GetChars() : "", prefixPadding.GetChars(), drawValue < 0 ? length - 1 : length, drawValue);
			else
				str.Format("%s%s%d", usePrefix ? str.GetChars() : "", prefixPadding.GetChars(), drawValue);

			RealignString();
		}